

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlVoid.cpp
# Opt level: O0

uint64 __thiscall
libebml::EbmlVoid::ReplaceWith
          (EbmlVoid *this,EbmlElement *EltToReplaceWith,IOCallback *output,bool ComeBackAfterward,
          bool bWithDefault)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  uint64 uVar7;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  filepos_t fVar8;
  filepos_t Length;
  undefined4 extraout_var_08;
  undefined7 in_register_00000009;
  ulong uVar9;
  int HeadAfter;
  int HeadBefore;
  undefined1 local_78 [8];
  EbmlVoid aTmp;
  uint64 CurrentPosition;
  bool bWithDefault_local;
  bool ComeBackAfterward_local;
  IOCallback *output_local;
  EbmlElement *EltToReplaceWith_local;
  EbmlVoid *this_local;
  
  uVar9 = CONCAT71(in_register_00000009,ComeBackAfterward) & 0xffffffffffffff01;
  (*EltToReplaceWith->_vptr_EbmlElement[8])
            (EltToReplaceWith,(ulong)bWithDefault & 1,0,
             CONCAT71((int7)(uVar9 >> 8),bWithDefault) & 0xffffffffffffff01);
  bVar1 = EbmlElement::HeadSize((EbmlElement *)this);
  iVar4 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
  iVar5 = (*EltToReplaceWith->_vptr_EbmlElement[9])();
  bVar2 = EbmlElement::HeadSize(EltToReplaceWith);
  if ((ulong)bVar1 + CONCAT44(extraout_var,iVar4) < CONCAT44(extraout_var_00,iVar5) + (ulong)bVar2)
  {
    this_local = (EbmlVoid *)0x0;
  }
  else {
    bVar1 = EbmlElement::HeadSize((EbmlElement *)this);
    iVar4 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
    iVar5 = (*EltToReplaceWith->_vptr_EbmlElement[9])();
    bVar2 = EbmlElement::HeadSize(EltToReplaceWith);
    if ((((ulong)bVar1 + CONCAT44(extraout_var_01,iVar4)) - CONCAT44(extraout_var_02,iVar5)) -
        (ulong)bVar2 == 1) {
      this_local = (EbmlVoid *)0x0;
    }
    else {
      iVar4 = (*output->_vptr_IOCallback[5])();
      aTmp.super_EbmlBinary.Data = (binary *)CONCAT44(extraout_var_03,iVar4);
      uVar7 = EbmlElement::GetElementPosition((EbmlElement *)this);
      (*output->_vptr_IOCallback[3])(output,uVar7,0);
      EbmlElement::Render(EltToReplaceWith,output,bWithDefault,false,false);
      bVar1 = EbmlElement::HeadSize((EbmlElement *)this);
      iVar4 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
      iVar5 = (*EltToReplaceWith->_vptr_EbmlElement[9])();
      bVar2 = EbmlElement::HeadSize(EltToReplaceWith);
      if (1 < (((ulong)bVar1 + CONCAT44(extraout_var_04,iVar4)) - CONCAT44(extraout_var_05,iVar5)) -
              (ulong)bVar2) {
        EbmlVoid((EbmlVoid *)local_78);
        bVar1 = EbmlElement::HeadSize((EbmlElement *)this);
        iVar4 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
        iVar5 = (*EltToReplaceWith->_vptr_EbmlElement[9])();
        bVar2 = EbmlElement::HeadSize(EltToReplaceWith);
        EbmlElement::SetSize_
                  ((EbmlElement *)local_78,
                   ~(ulong)bVar2 +
                   (((ulong)bVar1 + CONCAT44(extraout_var_06,iVar4)) -
                   CONCAT44(extraout_var_07,iVar5)));
        bVar1 = EbmlElement::HeadSize((EbmlElement *)local_78);
        fVar8 = EbmlElement::GetSize((EbmlElement *)local_78);
        Length = EbmlElement::GetSize((EbmlElement *)local_78);
        uVar6 = EbmlElement::GetSizeLength((EbmlElement *)local_78);
        bVar3 = EbmlElement::IsFiniteSize((EbmlElement *)local_78);
        iVar4 = CodedSizeLength(Length,uVar6,bVar3);
        EbmlElement::SetSize_((EbmlElement *)local_78,fVar8 - (long)iVar4);
        bVar2 = EbmlElement::HeadSize((EbmlElement *)local_78);
        if ((uint)bVar1 != (uint)bVar2) {
          fVar8 = EbmlElement::GetSize((EbmlElement *)local_78);
          uVar6 = EbmlElement::GetSizeLength((EbmlElement *)local_78);
          bVar3 = EbmlElement::IsFiniteSize((EbmlElement *)local_78);
          iVar4 = CodedSizeLength(fVar8,uVar6,bVar3);
          EbmlElement::SetSizeLength((EbmlElement *)local_78,iVar4 + ((uint)bVar1 - (uint)bVar2));
        }
        EbmlElement::RenderHead((EbmlElement *)local_78,output,false,bWithDefault,false);
        ~EbmlVoid((EbmlVoid *)local_78);
      }
      if ((char)uVar9 != '\0') {
        (*output->_vptr_IOCallback[3])(output,aTmp.super_EbmlBinary.Data,0);
      }
      iVar4 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
      bVar1 = EbmlElement::HeadSize((EbmlElement *)this);
      this_local = (EbmlVoid *)(CONCAT44(extraout_var_08,iVar4) + (ulong)bVar1);
    }
  }
  return (uint64)this_local;
}

Assistant:

uint64 EbmlVoid::ReplaceWith(EbmlElement & EltToReplaceWith, IOCallback & output, bool ComeBackAfterward, bool bWithDefault)
{
  EltToReplaceWith.UpdateSize(bWithDefault);
  if (HeadSize() + GetSize() < EltToReplaceWith.GetSize() + EltToReplaceWith.HeadSize()) {
    // the element can't be written here !
    return INVALID_FILEPOS_T;
  }
  if (HeadSize() + GetSize() - EltToReplaceWith.GetSize() - EltToReplaceWith.HeadSize() == 1) {
    // there is not enough space to put a filling element
    return INVALID_FILEPOS_T;
  }

  uint64 CurrentPosition = output.getFilePointer();

  output.setFilePointer(GetElementPosition());
  EltToReplaceWith.Render(output, bWithDefault);

  if (HeadSize() + GetSize() - EltToReplaceWith.GetSize() - EltToReplaceWith.HeadSize() > 1) {
    // fill the rest with another void element
    EbmlVoid aTmp;
    aTmp.SetSize_(HeadSize() + GetSize() - EltToReplaceWith.GetSize() - EltToReplaceWith.HeadSize() - 1); // 1 is the length of the Void ID
    int HeadBefore = aTmp.HeadSize();
    aTmp.SetSize_(aTmp.GetSize() - CodedSizeLength(aTmp.GetSize(), aTmp.GetSizeLength(), aTmp.IsFiniteSize()));
    int HeadAfter = aTmp.HeadSize();
    if (HeadBefore != HeadAfter) {
      aTmp.SetSizeLength(CodedSizeLength(aTmp.GetSize(), aTmp.GetSizeLength(), aTmp.IsFiniteSize()) - (HeadAfter - HeadBefore));
    }
    aTmp.RenderHead(output, false, bWithDefault); // the rest of the data is not rewritten
  }

  if (ComeBackAfterward) {
    output.setFilePointer(CurrentPosition);
  }

  return GetSize() + HeadSize();
}